

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_reducer.cpp
# Opt level: O1

void report_clusters(StringBuffer *defined_clusters,Vector *cluster_lengths,Vector *cluster_sizes,
                    long firstSequenceLength,long minimum_cluster_size,bool json,char sep,FILE *out)

{
  long lVar1;
  char *pcVar2;
  undefined7 in_register_00000089;
  bool bVar3;
  unsigned_long uVar4;
  
  if ((int)CONCAT71(in_register_00000089,json) != 0) {
    fwrite("\n{",2,1,(FILE *)out);
    if (cluster_sizes->vLength != 0) {
      bVar3 = false;
      uVar4 = 0;
      do {
        lVar1 = Vector::value(cluster_sizes,uVar4);
        if (minimum_cluster_size <= lVar1) {
          if (bVar3) {
            fwrite(",\n",2,1,(FILE *)out);
          }
          else {
            fputc(10,(FILE *)out);
          }
          lVar1 = Vector::value(cluster_sizes,uVar4);
          fprintf((FILE *)out,"{\"read_count\":%ld, \"sequence\":\"",lVar1);
          pcVar2 = stringText(defined_clusters,cluster_lengths,uVar4);
          dump_fasta(pcVar2,firstSequenceLength,out,false,false,0,0);
          fwrite("\"}",2,1,(FILE *)out);
          bVar3 = true;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < cluster_sizes->vLength);
    }
    fwrite("\n}\n",3,1,(FILE *)out);
    return;
  }
  if (cluster_sizes->vLength != 0) {
    uVar4 = 0;
    do {
      lVar1 = Vector::value(cluster_sizes,uVar4);
      if (minimum_cluster_size <= lVar1) {
        Vector::value(cluster_sizes,uVar4);
        fprintf((FILE *)out,">cluster_%ld%c%ld\n",uVar4,(ulong)(uint)(int)sep);
        pcVar2 = stringText(defined_clusters,cluster_lengths,uVar4);
        dump_fasta(pcVar2,firstSequenceLength,out,true,false,0,0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < cluster_sizes->vLength);
  }
  return;
}

Assistant:

void report_clusters (StringBuffer& defined_clusters, Vector& cluster_lengths, Vector& cluster_sizes, const long firstSequenceLength, const long minimum_cluster_size, bool json, char sep, FILE * out) {
    if (json) {
        bool do_comma = false;
        fprintf (out, "\n{");
        for (unsigned long k = 0; k < cluster_sizes.length(); k++) {
            if (cluster_sizes.value(k) >= minimum_cluster_size) {
                if (do_comma) {
                    fprintf (out, ",\n");
                } else {
                    fprintf (out, "\n");                
                }
                fprintf (out,"{\"read_count\":%ld, \"sequence\":\"", cluster_sizes.value(k));
                dump_fasta(stringText(defined_clusters, cluster_lengths, k), firstSequenceLength, out, false);
                fprintf (out,"\"}");
                do_comma = true;
            }
        } 
        fprintf (out, "\n}\n");    
    } else {
        for (unsigned long k = 0; k < cluster_sizes.length(); k++) {
            if (cluster_sizes.value(k) >= minimum_cluster_size) {
                fprintf (out, ">cluster_%ld%c%ld\n", k, sep, cluster_sizes.value(k));
                dump_fasta(stringText(defined_clusters, cluster_lengths, k), firstSequenceLength, out);
            }
        }
    }
}